

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.c
# Opt level: O2

apx_error_t apx_nodeData_create(apx_nodeData_t *self,apx_nodeDataBuffers_t *buffers)

{
  undefined8 uVar1;
  undefined8 uVar2;
  apx_size_t aVar3;
  apx_size_t aVar4;
  apx_size_t aVar5;
  apx_connectionCount_t *paVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  
  if (self != (apx_nodeData_t *)0x0) {
    if (buffers == (apx_nodeDataBuffers_t *)0x0) {
      self->is_weak_ref = false;
      self->definition_data = (uint8_t *)0x0;
      self->require_port_data = (uint8_t *)0x0;
      self->provide_port_data = (uint8_t *)0x0;
      self->definition_data_size = 0;
      self->require_port_data_size = 0;
      self->require_port_data_size = 0;
      self->provide_port_data_size = 0;
      self->num_require_ports = 0;
      self->num_provide_ports = 0;
      self->require_port_connection_count = (apx_connectionCount_t *)0x0;
      self->provide_port_connection_count = (apx_connectionCount_t *)0x0;
      self->checksum_data[0] = '\0';
      self->checksum_data[1] = '\0';
      self->checksum_data[2] = '\0';
      self->checksum_data[3] = '\0';
      self->checksum_data[4] = '\0';
      self->checksum_data[5] = '\0';
      self->checksum_data[6] = '\0';
      self->checksum_data[7] = '\0';
      self->checksum_data[8] = '\0';
      self->checksum_data[9] = '\0';
      self->checksum_data[10] = '\0';
      self->checksum_data[0xb] = '\0';
      self->checksum_data[0xc] = '\0';
      self->checksum_data[0xd] = '\0';
      self->checksum_data[0xe] = '\0';
      self->checksum_data[0xf] = '\0';
      self->checksum_data[0x10] = '\0';
      self->checksum_data[0x11] = '\0';
      self->checksum_data[0x12] = '\0';
      self->checksum_data[0x13] = '\0';
      self->checksum_data[0x14] = '\0';
      self->checksum_data[0x15] = '\0';
      self->checksum_data[0x16] = '\0';
      self->checksum_data[0x17] = '\0';
      self->checksum_data[0x18] = '\0';
      self->checksum_data[0x19] = '\0';
      self->checksum_data[0x1a] = '\0';
      self->checksum_data[0x1b] = '\0';
      self->checksum_data[0x1c] = '\0';
      self->checksum_data[0x1d] = '\0';
      self->checksum_data[0x1e] = '\0';
      self->checksum_data[0x1f] = '\0';
      self->checksum_type = '\0';
    }
    else {
      self->is_weak_ref = true;
      self->definition_data = buffers->definition_data;
      uVar1 = buffers->provide_port_data;
      uVar2 = buffers->require_port_data;
      auVar10._8_4_ = (int)uVar1;
      auVar10._0_8_ = uVar2;
      auVar10._12_4_ = (int)((ulong)uVar1 >> 0x20);
      self->require_port_data = (uint8_t *)uVar2;
      self->provide_port_data = (uint8_t *)auVar10._8_8_;
      self->definition_data_size = buffers->definition_data_size;
      paVar6 = buffers->provide_port_connection_count;
      self->require_port_connection_count = buffers->require_port_connection_count;
      self->provide_port_connection_count = paVar6;
      aVar3 = buffers->provide_port_data_size;
      aVar4 = buffers->num_provide_ports;
      aVar5 = buffers->num_require_ports;
      self->require_port_data_size = buffers->require_port_data_size;
      self->provide_port_data_size = aVar3;
      self->num_require_ports = aVar5;
      self->num_provide_ports = aVar4;
      self->checksum_type = buffers->checksum_type;
      uVar7 = *(undefined8 *)(buffers->checksum_data + 8);
      uVar8 = *(undefined8 *)(buffers->checksum_data + 0x10);
      uVar9 = *(undefined8 *)(buffers->checksum_data + 0x18);
      *(undefined8 *)self->checksum_data = *(undefined8 *)buffers->checksum_data;
      *(undefined8 *)(self->checksum_data + 8) = uVar7;
      *(undefined8 *)(self->checksum_data + 0x10) = uVar8;
      *(undefined8 *)(self->checksum_data + 0x18) = uVar9;
    }
    pthread_mutex_init((pthread_mutex_t *)&self->lock,(pthread_mutexattr_t *)0x0);
  }
  return 0;
}

Assistant:

apx_error_t apx_nodeData_create(apx_nodeData_t *self, apx_nodeDataBuffers_t *buffers)
{
   if (self != NULL)
   {
      if (buffers != NULL)
      {
         self->is_weak_ref = true;
         self->definition_data = buffers->definition_data;
         self->require_port_data = buffers->require_port_data;
         self->provide_port_data = buffers->provide_port_data;
         self->definition_data_size = buffers->definition_data_size;
         self->require_port_data_size = buffers->require_port_data_size;
         self->provide_port_data_size = buffers->provide_port_data_size;
         self->require_port_connection_count = buffers->require_port_connection_count;
         self->provide_port_connection_count = buffers->provide_port_connection_count;
         self->num_require_ports = buffers->num_require_ports;
         self->num_provide_ports = buffers->num_provide_ports;
         apx_nodeData_set_checksum_data(self, buffers->checksum_type, &buffers->checksum_data[0]);
      }
      else
      {
         self->is_weak_ref = false;
         self->definition_data = NULL;
         self->require_port_data = NULL;
         self->provide_port_data = NULL;
         self->definition_data_size = 0u;
         self->require_port_data_size = 0u;
         self->provide_port_data_size = 0u;
         self->require_port_connection_count = NULL;
         self->provide_port_connection_count = NULL;
         self->num_require_ports = 0u;
         self->num_provide_ports = 0u;
         self->checksum_type = RMF_DIGEST_TYPE_NONE;
         memset(&self->checksum_data[0], 0, sizeof(self->checksum_data));
      }
#ifndef APX_EMBEDDED
      MUTEX_INIT(self->lock);
#endif
   }
   return APX_NO_ERROR;
}